

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesBodySharedMass.cpp
# Opt level: O3

void __thiscall
chrono::ChVariablesBodySharedMass::Compute_inc_invMb_v
          (ChVariablesBodySharedMass *this,ChVectorRef *result,ChVectorConstRef vect)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ChSharedMassBody *pCVar13;
  PointerType pdVar14;
  ulong *puVar15;
  int iVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  
  lVar10 = (vect->
           super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
           ).
           super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
           .m_rows.m_value;
  iVar16 = (*(this->super_ChVariablesBody).super_ChVariables._vptr_ChVariables[2])();
  if (lVar10 != iVar16) {
    __assert_fail("vect.size() == Get_ndof()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/solver/ChVariablesBodySharedMass.cpp"
                  ,0x5c,
                  "virtual void chrono::ChVariablesBodySharedMass::Compute_inc_invMb_v(ChVectorRef, ChVectorConstRef) const"
                 );
  }
  lVar10 = *(long *)&(result->
                     super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                     ).field_0x8;
  iVar16 = (*(this->super_ChVariablesBody).super_ChVariables._vptr_ChVariables[2])(this);
  if (lVar10 != iVar16) {
    __assert_fail("result.size() == Get_ndof()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/solver/ChVariablesBodySharedMass.cpp"
                  ,0x5d,
                  "virtual void chrono::ChVariablesBodySharedMass::Compute_inc_invMb_v(ChVectorRef, ChVectorConstRef) const"
                 );
  }
  uVar11 = (vect->
           super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
           ).
           super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
           .m_rows.m_value;
  if (0 < (long)uVar11) {
    uVar12 = *(ulong *)&(result->
                        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                        ).field_0x8;
    if (0 < (long)uVar12) {
      pCVar13 = this->sharedmass;
      pdVar14 = (vect->
                super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                ).
                super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                .m_data;
      puVar15 = *(ulong **)
                 &result->
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
      ;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = pCVar13->inv_mass;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = *pdVar14;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = *puVar15;
      auVar1 = vfmadd213sd_fma(auVar23,auVar17,auVar1);
      *puVar15 = auVar1._0_8_;
      if (uVar11 == 1) goto LAB_007dfc04;
      if (uVar12 != 1) {
        auVar18._8_8_ = 0;
        auVar18._0_8_ = pCVar13->inv_mass;
        auVar24._8_8_ = 0;
        auVar24._0_8_ = pdVar14[1];
        auVar2._8_8_ = 0;
        auVar2._0_8_ = puVar15[1];
        auVar1 = vfmadd213sd_fma(auVar24,auVar18,auVar2);
        puVar15[1] = auVar1._0_8_;
        if (uVar11 < 3) goto LAB_007dfc04;
        if (2 < uVar12) {
          auVar19._8_8_ = 0;
          auVar19._0_8_ = pCVar13->inv_mass;
          auVar25._8_8_ = 0;
          auVar25._0_8_ = pdVar14[2];
          auVar3._8_8_ = 0;
          auVar3._0_8_ = puVar15[2];
          auVar1 = vfmadd213sd_fma(auVar25,auVar19,auVar3);
          puVar15[2] = auVar1._0_8_;
          if (((uVar11 == 3) || (uVar11 < 5)) || (uVar11 == 5)) goto LAB_007dfc04;
          if (uVar12 != 3) {
            auVar20._8_8_ = 0;
            auVar20._0_8_ =
                 (pCVar13->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
            auVar29._8_8_ = 0;
            auVar29._0_8_ =
                 (pCVar13->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
            auVar4._8_8_ = 0;
            auVar4._0_8_ = pdVar14[3];
            auVar26._8_8_ = 0;
            auVar26._0_8_ =
                 (pCVar13->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1] * pdVar14[4];
            auVar1 = vfmadd231sd_fma(auVar26,auVar20,auVar4);
            auVar5._8_8_ = 0;
            auVar5._0_8_ = pdVar14[5];
            auVar1 = vfmadd231sd_fma(auVar1,auVar29,auVar5);
            puVar15[3] = (ulong)(auVar1._0_8_ + (double)puVar15[3]);
            if (4 < uVar12) {
              auVar27._8_8_ = 0;
              auVar27._0_8_ =
                   (pCVar13->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[3];
              auVar21._8_8_ = 0;
              auVar21._0_8_ =
                   (pCVar13->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[5];
              auVar6._8_8_ = 0;
              auVar6._0_8_ = pdVar14[3];
              auVar30._8_8_ = 0;
              auVar30._0_8_ =
                   (pCVar13->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[4] * pdVar14[4];
              auVar1 = vfmadd231sd_fma(auVar30,auVar27,auVar6);
              auVar7._8_8_ = 0;
              auVar7._0_8_ = pdVar14[5];
              auVar1 = vfmadd231sd_fma(auVar1,auVar21,auVar7);
              puVar15[4] = (ulong)(auVar1._0_8_ + (double)puVar15[4]);
              if (uVar12 != 5) {
                auVar28._8_8_ = 0;
                auVar28._0_8_ =
                     (pCVar13->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[6];
                auVar22._8_8_ = 0;
                auVar22._0_8_ =
                     (pCVar13->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[8];
                auVar8._8_8_ = 0;
                auVar8._0_8_ = pdVar14[3];
                auVar31._8_8_ = 0;
                auVar31._0_8_ =
                     (pCVar13->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[7] * pdVar14[4];
                auVar1 = vfmadd231sd_fma(auVar31,auVar28,auVar8);
                auVar9._8_8_ = 0;
                auVar9._0_8_ = pdVar14[5];
                auVar1 = vfmadd231sd_fma(auVar1,auVar22,auVar9);
                puVar15[5] = (ulong)(auVar1._0_8_ + (double)puVar15[5]);
                return;
              }
            }
          }
        }
      }
    }
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 1>::operator()(Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 1]"
                 );
  }
LAB_007dfc04:
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, 0>::operator()(Index) const [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
               );
}

Assistant:

void ChVariablesBodySharedMass::Compute_inc_invMb_v(ChVectorRef result, ChVectorConstRef vect) const {
    assert(vect.size() == Get_ndof());
    assert(result.size() == Get_ndof());

    // optimized unrolled operations
    result(0) += sharedmass->inv_mass * vect(0);
    result(1) += sharedmass->inv_mass * vect(1);
    result(2) += sharedmass->inv_mass * vect(2);
    result(3) += sharedmass->inv_inertia(0, 0) * vect(3) + sharedmass->inv_inertia(0, 1) * vect(4) +
                 sharedmass->inv_inertia(0, 2) * vect(5);
    result(4) += sharedmass->inv_inertia(1, 0) * vect(3) + sharedmass->inv_inertia(1, 1) * vect(4) +
                 sharedmass->inv_inertia(1, 2) * vect(5);
    result(5) += sharedmass->inv_inertia(2, 0) * vect(3) + sharedmass->inv_inertia(2, 1) * vect(4) +
                 sharedmass->inv_inertia(2, 2) * vect(5);
}